

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O2

void __thiscall
TPZEigenAnalysis::TPZEigenAnalysis
          (TPZEigenAnalysis *this,TPZAutoPointer<TPZCompMesh> *mesh,bool mustOptimizeBandwidth,
          ostream *out)

{
  complex<double> *__s;
  TPZAutoPointer<TPZCompMesh> local_28;
  
  local_28 = (TPZAutoPointer<TPZCompMesh>)mesh->fRef;
  LOCK();
  ((local_28.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_28.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZAnalysis::TPZAnalysis
            (&this->super_TPZAnalysis,&PTR_PTR_0179fae0,&local_28,mustOptimizeBandwidth,out);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_28);
  (this->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZEigenAnalysis_0179f9d8;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0164ea10;
  __s = (this->fEigenvalues).fExtAlloc;
  memset(__s,0,0xa0);
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fStore = __s;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fNElements = 0;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fNAlloc = 0;
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&this->fEigenvectors);
  this->fCalcVectors = true;
  return;
}

Assistant:

TPZEigenAnalysis::TPZEigenAnalysis(TPZAutoPointer<TPZCompMesh> mesh,
                                   bool mustOptimizeBandwidth,
                                   std::ostream &out)
  : TPZAnalysis(mesh, mustOptimizeBandwidth, out)
{

}